

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O3

int md5_test(void)

{
  size_t inlen;
  long lVar1;
  uchar *in;
  undefined1 auVar2 [16];
  uchar tmp [16];
  uchar local_98;
  uchar uStack_97;
  uchar uStack_96;
  uchar uStack_95;
  uchar uStack_94;
  uchar uStack_93;
  uchar uStack_92;
  uchar uStack_91;
  uchar uStack_90;
  uchar uStack_8f;
  uchar uStack_8e;
  uchar uStack_8d;
  uchar uStack_8c;
  uchar uStack_8b;
  uchar uStack_8a;
  uchar uStack_89;
  hash_state local_88;
  
  in = "";
  lVar1 = 0;
  do {
    local_88._8_8_ = 0xefcdab8967452301;
    local_88._16_8_ = 0x1032547698badcfe;
    local_88.sha1.state[4] = 0;
    local_88.sha1.length = 0;
    inlen = strlen((char *)in);
    md5_process(&local_88,in,inlen);
    md5_done(&local_88,&local_98);
    auVar2[0] = -(md5_test::tests[0].hash[lVar1] == local_98);
    auVar2[1] = -(md5_test::tests[0].hash[lVar1 + 1] == uStack_97);
    auVar2[2] = -(md5_test::tests[0].hash[lVar1 + 2] == uStack_96);
    auVar2[3] = -(md5_test::tests[0].hash[lVar1 + 3] == uStack_95);
    auVar2[4] = -(md5_test::tests[0].hash[lVar1 + 4] == uStack_94);
    auVar2[5] = -(md5_test::tests[0].hash[lVar1 + 5] == uStack_93);
    auVar2[6] = -(md5_test::tests[0].hash[lVar1 + 6] == uStack_92);
    auVar2[7] = -(md5_test::tests[0].hash[lVar1 + 7] == uStack_91);
    auVar2[8] = -(md5_test::tests[0].hash[lVar1 + 8] == uStack_90);
    auVar2[9] = -(md5_test::tests[0].hash[lVar1 + 9] == uStack_8f);
    auVar2[10] = -(md5_test::tests[0].hash[lVar1 + 10] == uStack_8e);
    auVar2[0xb] = -(md5_test::tests[0].hash[lVar1 + 0xb] == uStack_8d);
    auVar2[0xc] = -(md5_test::tests[0].hash[lVar1 + 0xc] == uStack_8c);
    auVar2[0xd] = -(md5_test::tests[0].hash[lVar1 + 0xd] == uStack_8b);
    auVar2[0xe] = -(md5_test::tests[0].hash[lVar1 + 0xe] == uStack_8a);
    auVar2[0xf] = -(md5_test::tests[0].hash[lVar1 + 0xf] == uStack_89);
    if ((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe | (ushort)(auVar2[0xf] >> 7) << 0xf)
        != 0xffff) {
      return 5;
    }
    in = *(uchar **)(md5_test::tests[1].hash + lVar1 + -8);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0xa8);
  return 0;
}

Assistant:

int  md5_test(void)
{
 #ifndef LTC_TEST
    return CRYPT_NOP;
 #else
  static const struct {
      char *msg;
      unsigned char hash[16];
  } tests[] = {
    { "",
      { 0xd4, 0x1d, 0x8c, 0xd9, 0x8f, 0x00, 0xb2, 0x04,
        0xe9, 0x80, 0x09, 0x98, 0xec, 0xf8, 0x42, 0x7e } },
    { "a",
      {0x0c, 0xc1, 0x75, 0xb9, 0xc0, 0xf1, 0xb6, 0xa8,
       0x31, 0xc3, 0x99, 0xe2, 0x69, 0x77, 0x26, 0x61 } },
    { "abc",
      { 0x90, 0x01, 0x50, 0x98, 0x3c, 0xd2, 0x4f, 0xb0,
        0xd6, 0x96, 0x3f, 0x7d, 0x28, 0xe1, 0x7f, 0x72 } },
    { "message digest",
      { 0xf9, 0x6b, 0x69, 0x7d, 0x7c, 0xb7, 0x93, 0x8d,
        0x52, 0x5a, 0x2f, 0x31, 0xaa, 0xf1, 0x61, 0xd0 } },
    { "abcdefghijklmnopqrstuvwxyz",
      { 0xc3, 0xfc, 0xd3, 0xd7, 0x61, 0x92, 0xe4, 0x00,
        0x7d, 0xfb, 0x49, 0x6c, 0xca, 0x67, 0xe1, 0x3b } },
    { "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789",
      { 0xd1, 0x74, 0xab, 0x98, 0xd2, 0x77, 0xd9, 0xf5,
        0xa5, 0x61, 0x1c, 0x2c, 0x9f, 0x41, 0x9d, 0x9f } },
    { "12345678901234567890123456789012345678901234567890123456789012345678901234567890",
      { 0x57, 0xed, 0xf4, 0xa2, 0x2b, 0xe3, 0xc9, 0x55,
        0xac, 0x49, 0xda, 0x2e, 0x21, 0x07, 0xb6, 0x7a } },
    { NULL, { 0 } }
  };

  int i;
  unsigned char tmp[16];
  hash_state md;

  for (i = 0; tests[i].msg != NULL; i++) {
      md5_init(&md);
      md5_process(&md, (unsigned char *)tests[i].msg, (unsigned long)strlen(tests[i].msg));
      md5_done(&md, tmp);
      if (XMEMCMP(tmp, tests[i].hash, 16) != 0) {
         return CRYPT_FAIL_TESTVECTOR;
      }
  }
  return CRYPT_OK;
 #endif
}